

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

int __thiscall QCompletionModel::columnCount(QCompletionModel *this,QModelIndex *param_2)

{
  int iVar1;
  arrow_operator_result ppQVar2;
  long in_FS_OFFSET;
  QCompletionModelPrivate *d;
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *in_stack_ffffffffffffffb0;
  QAbstractItemModel *pQVar3;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QCompletionModel *)0xa68dda);
  ppQVar2 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
            ::operator->(in_stack_ffffffffffffffb0);
  pQVar3 = *ppQVar2;
  QModelIndex::QModelIndex((QModelIndex *)0xa68e07);
  iVar1 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QCompletionModel::columnCount(const QModelIndex &) const
{
    Q_D(const QCompletionModel);
    return d->model->columnCount();
}